

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::ValidateMapEntry
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptor *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar1;
  long lVar2;
  FieldDescriptor *this_01;
  bool bVar3;
  Type TVar4;
  uint uVar5;
  Descriptor *pDVar6;
  EnumDescriptor *pEVar7;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pDVar6 = FieldDescriptor::message_type(field);
  if ((((*(int *)(pDVar6 + 0x78) == 0) && (*(int *)(field + 0x4c) == 3)) &&
      (*(int *)(pDVar6 + 0x68) == 0)) &&
     (((*(int *)(pDVar6 + 0x48) == 0 && (*(int *)(pDVar6 + 0x58) == 0)) &&
      (*(int *)(pDVar6 + 0x2c) == 2)))) {
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pDVar6;
    anon_unknown_1::ToCamelCase(&local_70,*(string **)field,false);
    std::operator+(&local_50,&local_70,"Entry");
    bVar3 = std::operator!=(__lhs,&local_50);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      lVar1 = *(long *)(field + 0x58);
      lVar2 = *(long *)(pDVar6 + 0x18);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (((lVar1 == lVar2) &&
          (this_01 = *(FieldDescriptor **)(pDVar6 + 0x30), *(int *)(this_01 + 0x4c) == 1)) &&
         ((*(int *)(this_01 + 0x38) == 1 &&
          (((bVar3 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       **)this_01,"key"), !bVar3 && (*(int *)(this_01 + 0xf4) == 1))
           && (*(int *)(this_01 + 0xe0) == 2)))))) {
        this_00 = this_01 + 0xa8;
        bVar3 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  **)this_00,"value");
        if (!bVar3) {
          TVar4 = FieldDescriptor::type(this_01);
          uVar5 = TVar4 - TYPE_DOUBLE;
          if ((uVar5 < 0xe) && ((0x2e03U >> (uVar5 & 0x1f) & 1) != 0)) {
            AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                     &DAT_0039b058 + *(int *)(&DAT_0039b058 + (ulong)uVar5 * 4));
          }
          TVar4 = FieldDescriptor::type(this_00);
          if (TVar4 != TYPE_ENUM) {
            return true;
          }
          pEVar7 = FieldDescriptor::enum_type(this_00);
          if (*(int *)(*(long *)(pEVar7 + 0x30) + 0x10) == 0) {
            return true;
          }
          AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                   "Enum value in map must define 0 as the first value.");
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool DescriptorBuilder::ValidateMapEntry(FieldDescriptor* field,
                                         const FieldDescriptorProto& proto) {
  const Descriptor* message = field->message_type();
  if (// Must not contain extensions, extension range or nested message or
      // enums
      message->extension_count() != 0 ||
      field->label() != FieldDescriptor::LABEL_REPEATED ||
      message->extension_range_count() != 0 ||
      message->nested_type_count() != 0 || message->enum_type_count() != 0 ||
      // Must contain exactly two fields
      message->field_count() != 2 ||
      // Field name and message name must match
      message->name() != ToCamelCase(field->name(), false) + "Entry" ||
      // Entry message must be in the same containing type of the field.
      field->containing_type() != message->containing_type()) {
    return false;
  }

  const FieldDescriptor* key = message->field(0);
  const FieldDescriptor* value = message->field(1);
  if (key->label() != FieldDescriptor::LABEL_OPTIONAL || key->number() != 1 ||
      key->name() != "key") {
    return false;
  }
  if (value->label() != FieldDescriptor::LABEL_OPTIONAL ||
      value->number() != 2 || value->name() != "value") {
    return false;
  }

  // Check key types are legal.
  switch (key->type()) {
    case FieldDescriptor::TYPE_ENUM:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be enum types.");
      break;
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_BYTES:
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Key in map fields cannot be float/double, bytes or message types.");
      break;
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
      // Legal cases
      break;
    // Do not add a default, so that the compiler will complain when new types
    // are added.
  }

  if (value->type() == FieldDescriptor::TYPE_ENUM) {
    if (value->enum_type()->value(0)->number() != 0) {
      AddError(
          field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
          "Enum value in map must define 0 as the first value.");
    }
  }

  return true;
}